

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_macro_function.cpp
# Opt level: O2

unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> __thiscall
duckdb::TableMacroFunction::Deserialize(TableMacroFunction *this,Deserializer *deserializer)

{
  tuple<duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_> this_00;
  pointer pTVar1;
  __uniq_ptr_impl<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
  .super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
        )operator_new(0x68);
  TableMacroFunction((TableMacroFunction *)
                     this_00.
                     super__Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
                     .super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
  .super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl =
       (tuple<duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>)
       (tuple<duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
       .super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl;
  pTVar1 = unique_ptr<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>,_true>
           ::operator->((unique_ptr<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (deserializer,200,"query_node",&pTVar1->query_node);
  (this->super_MacroFunction)._vptr_MacroFunction =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
       .super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)
         (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)this;
}

Assistant:

unique_ptr<MacroFunction> TableMacroFunction::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<TableMacroFunction>(new TableMacroFunction());
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(200, "query_node", result->query_node);
	return std::move(result);
}